

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::solve_inequality
          (branch_and_bound_solver<baryonyx::itm::maximize_tag,_double> *this)

{
  pointer *ppnVar1;
  int iVar2;
  uint uVar3;
  pointer piVar4;
  pointer pcVar5;
  undefined8 uVar6;
  bool bVar7;
  double *pdVar8;
  pointer piVar9;
  pointer pnVar10;
  long lVar11;
  ptrdiff_t _Num;
  ulong uVar12;
  double dVar13;
  undefined1 auVar14 [16];
  
  piVar9 = (this->items).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar4 = (this->items).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this->lower_bound = -INFINITY;
  lVar11 = (long)piVar4 - (long)piVar9;
  if (lVar11 == 0) {
    dVar13 = 0.0;
  }
  else {
    lVar11 = lVar11 >> 5;
    dVar13 = 0.0;
    do {
      pdVar8 = &piVar9->r;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = *pdVar8;
      piVar9 = piVar9 + 1;
      lVar11 = lVar11 + -1;
      uVar6 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar14,1);
      bVar7 = (bool)((byte)uVar6 & 1);
      dVar13 = (double)((ulong)bVar7 * (long)(dVar13 + *pdVar8) + (ulong)!bVar7 * (long)dVar13);
    } while (lVar11 != 0);
  }
  this->upper_bound = dVar13;
  make_init_node_0(this);
  pnVar10 = (this->nodes).
            super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  iVar2 = pnVar10[-1].sumfactor;
  if (this->b_max < iVar2 || iVar2 < this->b_min) {
    if (this->b_max < iVar2) {
      uVar3 = pnVar10[-1].variables;
      shared_subvector::check_index(&this->subvector,uVar3);
      *(size_type *)
       ((this->subvector).m_container.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
        _M_impl.super__Vector_impl_data._M_start + uVar3) = (this->subvector).m_free_list_head;
      (this->subvector).m_free_list_head = uVar3;
      ppnVar1 = &(this->nodes).
                 super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppnVar1 = *ppnVar1 + -1;
    }
  }
  else {
    this->upper_bound = pnVar10[-1].sumr;
    uVar12 = (ulong)(this->subvector).m_element_size;
    if (uVar12 != 0) {
      pcVar5 = (this->subvector).m_container.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memmove(pcVar5 + this->solution,pcVar5 + pnVar10[-1].variables,uVar12);
    }
  }
  make_init_node_1(this);
  pnVar10 = (this->nodes).
            super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  iVar2 = pnVar10[-1].sumfactor;
  if (this->b_max < iVar2 || iVar2 < this->b_min) {
    if (this->b_max < iVar2) {
      uVar3 = pnVar10[-1].variables;
      shared_subvector::check_index(&this->subvector,uVar3);
      *(size_type *)
       ((this->subvector).m_container.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
        _M_impl.super__Vector_impl_data._M_start + uVar3) = (this->subvector).m_free_list_head;
      (this->subvector).m_free_list_head = uVar3;
      pnVar10 = (this->nodes).
                super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1;
      (this->nodes).
      super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
      ._M_impl.super__Vector_impl_data._M_finish = pnVar10;
    }
  }
  else {
    this->upper_bound = pnVar10[-1].sumr;
    uVar12 = (ulong)(this->subvector).m_element_size;
    if (uVar12 != 0) {
      pcVar5 = (this->subvector).m_container.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memmove(pcVar5 + this->solution,pcVar5 + pnVar10[-1].variables,uVar12);
      pnVar10 = (this->nodes).
                super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  if ((this->nodes).
      super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
      ._M_impl.super__Vector_impl_data._M_start != pnVar10) {
    do {
      make_next_inequality_node(this);
    } while ((this->nodes).
             super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->nodes).
             super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void solve_inequality()
    {
        lower_bound = compute_lower_bound();
        upper_bound = compute_upper_bound();

        make_init_node_0();
        if (b_min <= nodes.back().sumfactor &&
            nodes.back().sumfactor <= b_max) {
            upper_bound = nodes.back().sumr;
            subvector.copy(nodes.back().variables, solution);
        } else if (nodes.back().sumfactor > b_max) {
            subvector.remove(nodes.back().variables);
            nodes.pop_back(); // Remove the branch
        }

        make_init_node_1();
        if (b_min <= nodes.back().sumfactor &&
            nodes.back().sumfactor <= b_max) {
            upper_bound = nodes.back().sumr;
            subvector.copy(nodes.back().variables, solution);
        } else if (nodes.back().sumfactor > b_max) {
            subvector.remove(nodes.back().variables);
            nodes.pop_back(); // Remove the branch
        }

        while (!nodes.empty())
            make_next_inequality_node();
    }